

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

deUint32 *
vk::BinaryRegistryDetail::anon_unknown_8::findBinaryIndex
          (BinaryIndexAccess *index,ProgramIdentifier *id)

{
  deUint32 dVar1;
  uint uVar2;
  deBool dVar3;
  BinaryIndexNode *pBVar4;
  const_reference pvVar5;
  undefined1 *puVar6;
  size_t sVar7;
  InternalError *pIVar8;
  BinaryIndexNode *curNode;
  size_t wordNdx;
  size_t nodeNdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  ProgramIdentifier *id_local;
  BinaryIndexAccess *index_local;
  
  words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)id;
  getSearchPath((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nodeNdx,id);
  wordNdx = 0;
  curNode = (BinaryIndexNode *)0x0;
  while( true ) {
    while( true ) {
      pBVar4 = LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::operator[](index,wordNdx);
      dVar1 = pBVar4->word;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nodeNdx,
                          (size_type)curNode);
      if (dVar1 == *pvVar5) break;
      if (pBVar4->word == 0) {
        index_local = (BinaryIndexAccess *)0x0;
        goto LAB_01188920;
      }
      wordNdx = wordNdx + 1;
      do {
        dVar3 = ::deGetFalse();
        if ((dVar3 != 0) ||
           (sVar7 = LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::size(index),
           sVar7 <= wordNdx)) {
          pIVar8 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (pIVar8,(char *)0x0,"nodeNdx < index->size()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.cpp"
                     ,0xd0);
          __cxa_throw(pIVar8,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
        }
        dVar3 = ::deGetFalse();
      } while (dVar3 != 0);
    }
    puVar6 = (undefined1 *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nodeNdx);
    if (puVar6 <= (undefined1 *)((long)&curNode->word + 1U)) break;
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) ||
         (uVar2 = pBVar4->index,
         sVar7 = LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::size(index),
         sVar7 <= uVar2)) {
        pIVar8 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar8,(char *)0x0,"(size_t)curNode.index < index->size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.cpp"
                   ,0xc1);
        __cxa_throw(pIVar8,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    wordNdx = (size_t)pBVar4->index;
    curNode = (BinaryIndexNode *)((long)&curNode->word + 1);
  }
  puVar6 = (undefined1 *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nodeNdx);
  if ((undefined1 *)((long)&curNode->word + 1U) == puVar6) {
    index_local = (BinaryIndexAccess *)&pBVar4->index;
  }
  else {
    index_local = (BinaryIndexAccess *)0x0;
  }
LAB_01188920:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&nodeNdx);
  return (deUint32 *)index_local;
}

Assistant:

const deUint32* findBinaryIndex (BinaryIndexAccess* index, const ProgramIdentifier& id)
{
	const vector<deUint32>	words	= getSearchPath(id);
	size_t					nodeNdx	= 0;
	size_t					wordNdx	= 0;

	for (;;)
	{
		const BinaryIndexNode&	curNode	= (*index)[nodeNdx];

		if (curNode.word == words[wordNdx])
		{
			if (wordNdx+1 < words.size())
			{
				TCU_CHECK_INTERNAL((size_t)curNode.index < index->size());

				nodeNdx  = curNode.index;
				wordNdx	+= 1;
			}
			else if (wordNdx+1 == words.size())
				return &curNode.index;
			else
				return DE_NULL;
		}
		else if (curNode.word != 0)
		{
			nodeNdx += 1;

			// Index should always be null-terminated
			TCU_CHECK_INTERNAL(nodeNdx < index->size());
		}
		else
			return DE_NULL;
	}

	return DE_NULL;
}